

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

int Ssw_SecSpecial(Aig_Man_t *pPart0,Aig_Man_t *pPart1,int nFrames,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  char *pcVar6;
  Aig_Man_t *pMiterCec;
  int nOuts;
  Aig_Man_t *local_38;
  uint local_2c;
  
  aVar4 = Abc_Clock();
  if (fVerbose != 0) {
    Aig_ManPrintStats(pPart0);
    Aig_ManPrintStats(pPart1);
  }
  local_38 = Saig_ManCreateMiterTwo(pPart0,pPart1,nFrames);
  if (fVerbose != 0) {
    Aig_ManPrintStats(local_38);
  }
  iVar2 = Fra_FraigCec(&local_38,100000,fVerbose);
  if (iVar2 == 0) {
    iVar3 = 0x6e73a4;
    printf("Networks are NOT EQUIVALENT.   ");
    Abc_Print(iVar3,"%s =","Time");
    aVar5 = Abc_Clock();
    Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar5 - aVar4) / 1000000.0);
    if ((int *)local_38->pData == (int *)0x0) {
      pcVar6 = "Counter-example is not available.";
    }
    else {
      iVar3 = Ssw_SecCexResimulate(local_38,(int *)local_38->pData,(int *)&local_2c);
      if (iVar3 != -1) {
        iVar1 = pPart0->nTruePos;
        if (iVar3 < nFrames * iVar1) {
          printf("Primary output %d has failed in frame %d.\n",
                 (long)iVar3 % (long)iVar1 & 0xffffffff,(long)iVar3 / (long)iVar1 & 0xffffffff);
        }
        else {
          printf("Flop input %d has failed in the last frame.\n");
        }
        printf("The counter-example detected %d incorrect POs or flop inputs.\n",(ulong)local_2c);
        goto LAB_00545048;
      }
      pcVar6 = "Counter-example verification has failed.";
    }
    puts(pcVar6);
  }
  else {
    if (iVar2 == 1) {
      pcVar6 = "Networks are equivalent.   ";
    }
    else {
      pcVar6 = "Networks are UNDECIDED.   ";
    }
    printf(pcVar6);
    iVar3 = (int)pcVar6;
    Abc_Print(iVar3,"%s =","Time");
    aVar5 = Abc_Clock();
    Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar5 - aVar4) / 1000000.0);
  }
LAB_00545048:
  fflush(_stdout);
  Aig_ManStop(local_38);
  return iVar2;
}

Assistant:

int Ssw_SecSpecial( Aig_Man_t * pPart0, Aig_Man_t * pPart1, int nFrames, int fVerbose )
{
//    extern int Fra_FraigCec( Aig_Man_t ** ppAig, int nConfLimit, int fVerbose );
    int iOut, nOuts;
    Aig_Man_t * pMiterCec;
    int RetValue;
    abctime clkTotal = Abc_Clock();
    if ( fVerbose )
    {
        Aig_ManPrintStats( pPart0 );
        Aig_ManPrintStats( pPart1 );
    }
//    Aig_ManDumpBlif( pPart0, "file0.blif", NULL, NULL );
//    Aig_ManDumpBlif( pPart1, "file1.blif", NULL, NULL );
//    assert( Aig_ManNodeNum(pPart0) <= Aig_ManNodeNum(pPart1) );
/*
    if ( Aig_ManNodeNum(pPart0) >= Aig_ManNodeNum(pPart1) )
    {
        printf( "Warning: The design after synthesis is smaller!\n" );
        printf( "This warning may indicate that the order of designs is changed.\n" );
        printf( "The solver expects the original design as first argument and\n" );
        printf( "the modified design as the second argument in \"absec\".\n" );
    }
*/
    // create two-level miter
    pMiterCec = Saig_ManCreateMiterTwo( pPart0, pPart1, nFrames );
    if ( fVerbose )
    {
        Aig_ManPrintStats( pMiterCec );
//        Aig_ManDumpBlif( pMiterCec, "miter01.blif", NULL, NULL );
//        printf( "The new miter is written into file \"%s\".\n", "miter01.blif" );
    }
    // run CEC on this miter
    RetValue = Fra_FraigCec( &pMiterCec, 100000, fVerbose );
    // transfer model if given
//    if ( pNtk2 == NULL )
//        pNtk1->pModel = pMiterCec->pData, pMiterCec->pData = NULL;
    // report the miter
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
        if ( pMiterCec->pData == NULL )
            printf( "Counter-example is not available.\n" );
        else
        {
            iOut = Ssw_SecCexResimulate( pMiterCec, (int *)pMiterCec->pData, &nOuts );
            if ( iOut == -1 )
                printf( "Counter-example verification has failed.\n" );
            else 
            {
                if ( iOut < Saig_ManPoNum(pPart0) * nFrames )
                    printf( "Primary output %d has failed in frame %d.\n", 
                        iOut%Saig_ManPoNum(pPart0), iOut/Saig_ManPoNum(pPart0) );
                else
                    printf( "Flop input %d has failed in the last frame.\n", 
                        iOut - Saig_ManPoNum(pPart0) * nFrames );
                printf( "The counter-example detected %d incorrect POs or flop inputs.\n", nOuts );
            }
        }
    }
    else
    {
        printf( "Networks are UNDECIDED.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    fflush( stdout );
    Aig_ManStop( pMiterCec );
    return RetValue;
}